

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

sexp_conflict
sexp_listen(sexp_conflict ctx,sexp_conflict self,sexp_conflict fileno,sexp_conflict backlog)

{
  undefined1 auVar1 [16];
  int __fd;
  int iVar2;
  uint uVar3;
  ulong in_RCX;
  int *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int res;
  int fd;
  sexp_conflict local_8;
  
  if ((((ulong)in_RDX & 3) == 0) && (*in_RDX == 0x12)) {
    if ((in_RCX & 1) == 1) {
      __fd = (int)*(undefined8 *)(in_RDX + 4);
      auVar1._8_8_ = (long)in_RCX >> 0x3f;
      auVar1._0_8_ = in_RCX & 0xfffffffffffffffe;
      iVar2 = listen(__fd,SUB164(auVar1 / SEXT816(2),0));
      if (-1 < iVar2) {
        uVar3 = fcntl(__fd,3);
        fcntl(__fd,4,(ulong)(uVar3 | 0x800));
      }
      local_8 = (sexp_conflict)0x3e;
      if (iVar2 == 0) {
        local_8 = (sexp_conflict)0x13e;
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_RCX);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x12,in_RDX);
  }
  return local_8;
}

Assistant:

sexp sexp_listen (sexp ctx, sexp self, sexp fileno, sexp backlog) {
  int fd, res;
  sexp_assert_type(ctx, sexp_filenop, SEXP_FILENO, fileno);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, backlog);
  fd = sexp_fileno_fd(fileno);
  res = listen(fd, sexp_unbox_fixnum(backlog));
#if SEXP_USE_GREEN_THREADS
  if (res >= 0)
    fcntl(fd, F_SETFL, fcntl(fd, F_GETFL) | O_NONBLOCK);
#endif
  return (res == 0) ? SEXP_TRUE : SEXP_FALSE;
}